

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralPlanarActionVarying::IfcStructuralPlanarActionVarying
          (IfcStructuralPlanarActionVarying *this)

{
  *(undefined ***)&this->field_0x1d8 = &PTR__Object_00816a50;
  *(undefined8 *)&this->field_0x1e0 = 0;
  *(char **)&this->field_0x1e8 = "IfcStructuralPlanarActionVarying";
  IfcStructuralPlanarAction::IfcStructuralPlanarAction
            (&this->super_IfcStructuralPlanarAction,&PTR_construction_vtable_24__00874138);
  *(undefined8 *)&(this->super_IfcStructuralPlanarAction).field_0x1b0 = 0;
  *(undefined8 *)
   &(this->super_IfcStructuralPlanarAction).super_IfcStructuralAction.super_IfcStructuralActivity.
    super_IfcProduct.super_IfcObject = 0x873fe0;
  *(undefined8 *)&this->field_0x1d8 = 0x874120;
  *(undefined8 *)
   &(this->super_IfcStructuralPlanarAction).super_IfcStructuralAction.super_IfcStructuralActivity.
    super_IfcProduct.super_IfcObject.field_0x88 = 0x874008;
  (this->super_IfcStructuralPlanarAction).super_IfcStructuralAction.super_IfcStructuralActivity.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0x874030;
  *(undefined8 *)
   &(this->super_IfcStructuralPlanarAction).super_IfcStructuralAction.super_IfcStructuralActivity.
    super_IfcProduct.super_IfcObject.field_0xd0 = 0x874058;
  *(undefined8 *)
   &(this->super_IfcStructuralPlanarAction).super_IfcStructuralAction.super_IfcStructuralActivity.
    super_IfcProduct.field_0x100 = 0x874080;
  *(undefined8 *)
   &(this->super_IfcStructuralPlanarAction).super_IfcStructuralAction.super_IfcStructuralActivity.
    field_0x138 = 0x8740a8;
  *(undefined8 *)&(this->super_IfcStructuralPlanarAction).super_IfcStructuralAction.field_0x178 =
       0x8740d0;
  *(undefined8 *)&(this->super_IfcStructuralPlanarAction).field_0x1a8 = 0x8740f8;
  *(undefined8 *)&(this->super_IfcStructuralPlanarAction).field_0x1b8 = 0;
  (this->SubsequentAppliedLoads).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SubsequentAppliedLoads).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SubsequentAppliedLoads).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

IfcStructuralPlanarActionVarying() : Object("IfcStructuralPlanarActionVarying") {}